

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

Ref<embree::XML> __thiscall embree::XML::child(XML *this,string *childID)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  const_reference pvVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  XML *in_RDI;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  XML *__rhs;
  string local_58 [16];
  ParseLocation *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __rhs = in_RDI;
  while( true ) {
    __lhs = local_38;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                       ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                         *)(in_RSI + 4));
    if (pbVar2 <= __lhs) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffb8);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff10);
      std::operator+(__lhs,in_stack_ffffffffffffff10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff10);
      std::runtime_error::runtime_error(this_00,local_58);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (in_RSI + 4),(size_type)local_38);
    _Var1 = std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs);
    if (_Var1) break;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_38->field_0x1;
  }
  pvVar3 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
           operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       *)(in_RSI + 4),(size_type)local_38);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pvVar3->ptr;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::XML>)__rhs;
}

Assistant:

const Ref<XML> child(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + childID + "\"");
    }